

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::updateNoClear(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,int p_col,
               number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *p_work,int *p_idx,int num)

{
  uint *puVar1;
  pointer pnVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  bool bVar10;
  fpclass_type fVar11;
  int32_t iVar12;
  type_conflict5 tVar13;
  int iVar14;
  int *piVar15;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg_00;
  long lVar16;
  long lVar17;
  int32_t *piVar18;
  long lVar19;
  long lVar20;
  uint uVar21;
  long lVar22;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  multiprecision local_e8 [8];
  uint auStack_e0 [2];
  uint local_d8 [2];
  undefined8 uStack_d0;
  undefined8 local_c8;
  int local_c0;
  undefined1 local_bc;
  fpclass_type local_b8;
  int32_t local_b4;
  multiprecision local_a8 [8];
  uint auStack_a0 [2];
  uint local_98 [2];
  undefined8 uStack_90;
  undefined8 local_88;
  int local_80;
  undefined1 local_7c;
  fpclass_type local_78;
  int32_t local_74;
  longlong local_70;
  cpp_dec_float<50U,_int,_void> local_68;
  
  result.m_backend.fpclass = cpp_dec_float_finite;
  result.m_backend.prec_elem = 10;
  result.m_backend.data._M_elems[0] = 0;
  result.m_backend.data._M_elems[1] = 0;
  result.m_backend.data._M_elems[2] = 0;
  result.m_backend.data._M_elems[3] = 0;
  result.m_backend.data._M_elems[4] = 0;
  result.m_backend.data._M_elems[5] = 0;
  result.m_backend.data._M_elems._24_5_ = 0;
  result.m_backend.data._M_elems[7]._1_3_ = 0;
  result.m_backend.data._M_elems._32_5_ = 0;
  result.m_backend.data._M_elems[9]._1_3_ = 0;
  result.m_backend.exp = 0;
  result.m_backend.neg = false;
  local_68.data._M_elems[0] = 1;
  local_68.data._M_elems[1] = 0;
  boost::multiprecision::default_ops::
  eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,long_long>
            (&result.m_backend,(longlong *)&local_68,&p_work[p_col].m_backend);
  local_68.data._M_elems[7]._1_3_ = result.m_backend.data._M_elems[7]._1_3_;
  local_68.data._M_elems._24_5_ = result.m_backend.data._M_elems._24_5_;
  local_68.data._M_elems[0] = result.m_backend.data._M_elems[0];
  local_68.data._M_elems[1] = result.m_backend.data._M_elems[1];
  local_68.data._M_elems[2] = result.m_backend.data._M_elems[2];
  local_68.data._M_elems[3] = result.m_backend.data._M_elems[3];
  local_68.data._M_elems[4] = result.m_backend.data._M_elems[4];
  local_68.data._M_elems[5] = result.m_backend.data._M_elems[5];
  local_68.data._M_elems[9]._1_3_ = result.m_backend.data._M_elems[9]._1_3_;
  local_68.data._M_elems._32_5_ = result.m_backend.data._M_elems._32_5_;
  local_68.exp = result.m_backend.exp;
  local_68.neg = result.m_backend.neg;
  local_68.fpclass = result.m_backend.fpclass;
  local_68.prec_elem = result.m_backend.prec_elem;
  iVar14 = makeLvec(this,num,p_col);
  pnVar2 = (this->l).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  piVar15 = (this->l).idx;
  lVar19 = (long)iVar14;
  piVar18 = &pnVar2[lVar19 + 1].m_backend.prec_elem;
  lVar20 = lVar19 << 0x20;
  lVar17 = 0;
  for (lVar22 = -4; iVar14 = *(int *)((long)p_idx + lVar22 + (long)num * 4), iVar14 != p_col;
      lVar22 = lVar22 + -4) {
    piVar15[lVar19 + lVar17] = iVar14;
    result.m_backend.fpclass = cpp_dec_float_finite;
    result.m_backend.prec_elem = 10;
    result.m_backend.data._M_elems[0] = 0;
    result.m_backend.data._M_elems[1] = 0;
    result.m_backend.data._M_elems[2] = 0;
    result.m_backend.data._M_elems[3] = 0;
    result.m_backend.data._M_elems[4] = 0;
    result.m_backend.data._M_elems[5] = 0;
    result.m_backend.data._M_elems._24_5_ = 0;
    result.m_backend.data._M_elems[7]._1_3_ = 0;
    result.m_backend.data._M_elems._32_5_ = 0;
    result.m_backend.data._M_elems[9]._1_3_ = 0;
    result.m_backend.exp = 0;
    result.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&result.m_backend,&local_68,&p_work[iVar14].m_backend);
    *(ulong *)(piVar18 + -0x13) =
         CONCAT35(result.m_backend.data._M_elems[9]._1_3_,result.m_backend.data._M_elems._32_5_);
    *(undefined8 *)(piVar18 + -0x17) = result.m_backend.data._M_elems._16_8_;
    *(ulong *)(piVar18 + -0x15) =
         CONCAT35(result.m_backend.data._M_elems[7]._1_3_,result.m_backend.data._M_elems._24_5_);
    *(undefined8 *)(piVar18 + -0x1b) = result.m_backend.data._M_elems._0_8_;
    *(undefined8 *)(piVar18 + -0x19) = result.m_backend.data._M_elems._8_8_;
    piVar18[-0x11] = result.m_backend.exp;
    *(bool *)(piVar18 + -0x10) = result.m_backend.neg;
    *(undefined8 *)(piVar18 + -0xf) = result.m_backend._48_8_;
    piVar18 = piVar18 + 0xe;
    lVar20 = lVar20 + 0x100000000;
    lVar17 = lVar17 + 1;
  }
  lVar16 = lVar20 >> 0x20;
  *(int *)((long)piVar15 + (lVar20 >> 0x1e)) = p_col;
  result.m_backend.fpclass = cpp_dec_float_finite;
  result.m_backend.prec_elem = 10;
  result.m_backend.data._M_elems[0] = 0;
  result.m_backend.data._M_elems[1] = 0;
  result.m_backend.data._M_elems[2] = 0;
  result.m_backend.data._M_elems[3] = 0;
  result.m_backend.data._M_elems[4] = 0;
  result.m_backend.data._M_elems[5] = 0;
  result.m_backend.data._M_elems._24_5_ = 0;
  result.m_backend.data._M_elems[7]._1_3_ = 0;
  result.m_backend.data._M_elems._32_5_ = 0;
  result.m_backend.data._M_elems[9]._1_3_ = 0;
  result.m_backend.exp = 0;
  result.m_backend.neg = false;
  local_70 = 1;
  boost::multiprecision::default_ops::
  eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,long_long>
            (&result.m_backend,&local_70,&local_68);
  *(ulong *)((long)pnVar2[lVar16].m_backend.data._M_elems + 0x20) =
       CONCAT35(result.m_backend.data._M_elems[9]._1_3_,result.m_backend.data._M_elems._32_5_);
  puVar1 = (uint *)((long)pnVar2[lVar16].m_backend.data._M_elems + 0x10);
  *(undefined8 *)puVar1 = result.m_backend.data._M_elems._16_8_;
  *(ulong *)(puVar1 + 2) =
       CONCAT35(result.m_backend.data._M_elems[7]._1_3_,result.m_backend.data._M_elems._24_5_);
  *(undefined8 *)pnVar2[lVar16].m_backend.data._M_elems = result.m_backend.data._M_elems._0_8_;
  *(undefined8 *)((long)pnVar2[lVar16].m_backend.data._M_elems + 8) =
       result.m_backend.data._M_elems._8_8_;
  pnVar2[lVar16].m_backend.exp = result.m_backend.exp;
  pnVar2[lVar16].m_backend.neg = result.m_backend.neg;
  pnVar2[lVar16].m_backend.fpclass = result.m_backend.fpclass;
  pnVar2[lVar16].m_backend.prec_elem = result.m_backend.prec_elem;
  piVar15 = (int *)((long)piVar15 + (lVar19 * 4 - lVar22));
  for (uVar21 = (num - (int)lVar17) - 2; -1 < (int)uVar21; uVar21 = uVar21 - 1) {
    iVar14 = p_idx[uVar21];
    *piVar15 = iVar14;
    result.m_backend.fpclass = cpp_dec_float_finite;
    result.m_backend.prec_elem = 10;
    result.m_backend.data._M_elems[0] = 0;
    result.m_backend.data._M_elems[1] = 0;
    result.m_backend.data._M_elems[2] = 0;
    result.m_backend.data._M_elems[3] = 0;
    result.m_backend.data._M_elems[4] = 0;
    result.m_backend.data._M_elems[5] = 0;
    result.m_backend.data._M_elems._24_5_ = 0;
    result.m_backend.data._M_elems[7]._1_3_ = 0;
    result.m_backend.data._M_elems._32_5_ = 0;
    result.m_backend.data._M_elems[9]._1_3_ = 0;
    result.m_backend.exp = 0;
    result.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&result.m_backend,&local_68,&p_work[iVar14].m_backend);
    bVar10 = result.m_backend.neg;
    iVar14 = result.m_backend.exp;
    uVar8 = result.m_backend.data._M_elems._16_8_;
    uVar6 = result.m_backend.data._M_elems._8_8_;
    uVar5 = result.m_backend.data._M_elems._0_8_;
    uVar4 = CONCAT35(result.m_backend.data._M_elems[9]._1_3_,result.m_backend.data._M_elems._32_5_);
    uVar3 = CONCAT35(result.m_backend.data._M_elems[7]._1_3_,result.m_backend.data._M_elems._24_5_);
    fVar11 = result.m_backend.fpclass;
    iVar12 = result.m_backend.prec_elem;
    *(undefined8 *)(piVar18 + -5) = uVar4;
    *(undefined8 *)(piVar18 + -9) = result.m_backend.data._M_elems._16_8_;
    *(undefined8 *)(piVar18 + -7) = uVar3;
    *(undefined8 *)(((cpp_dec_float<50U,_int,_void> *)(piVar18 + -0xd))->data)._M_elems =
         result.m_backend.data._M_elems._0_8_;
    *(undefined8 *)(piVar18 + -0xb) = result.m_backend.data._M_elems._8_8_;
    piVar18[-3] = result.m_backend.exp;
    *(bool *)(piVar18 + -2) = result.m_backend.neg;
    piVar18[-1] = result.m_backend.fpclass;
    *piVar18 = result.m_backend.prec_elem;
    local_a8 = (multiprecision  [8])result.m_backend.data._M_elems._0_8_;
    auStack_a0[0] = result.m_backend.data._M_elems[2];
    auStack_a0[1] = result.m_backend.data._M_elems[3];
    local_98[0] = result.m_backend.data._M_elems[4];
    local_98[1] = result.m_backend.data._M_elems[5];
    local_80 = result.m_backend.exp;
    local_7c = result.m_backend.neg;
    local_78 = result.m_backend.fpclass;
    local_74 = result.m_backend.prec_elem;
    uStack_90 = uVar3;
    local_88 = uVar4;
    boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              ((type *)&result.m_backend,local_a8,arg);
    tVar13 = boost::multiprecision::operator>
                       ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&result.m_backend,&this->maxabs);
    uVar9 = result.m_backend.data._M_elems._16_8_;
    uVar7 = result.m_backend.data._M_elems._8_8_;
    if (tVar13) {
      local_e8 = (multiprecision  [8])uVar5;
      result.m_backend.data._M_elems[2] = (uint)uVar6;
      result.m_backend.data._M_elems[3] = SUB84(uVar6,4);
      auStack_e0[0] = result.m_backend.data._M_elems[2];
      auStack_e0[1] = result.m_backend.data._M_elems[3];
      result.m_backend.data._M_elems[4] = (uint)uVar8;
      result.m_backend.data._M_elems[5] = SUB84(uVar8,4);
      local_d8[0] = result.m_backend.data._M_elems[4];
      local_d8[1] = result.m_backend.data._M_elems[5];
      local_c0 = iVar14;
      local_bc = bVar10;
      local_b8 = fVar11;
      local_b4 = iVar12;
      result.m_backend.data._M_elems._8_8_ = uVar7;
      result.m_backend.data._M_elems._16_8_ = uVar9;
      uStack_d0 = uVar3;
      local_c8 = uVar4;
      boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&result,local_e8,arg_00);
      *(ulong *)((this->maxabs).m_backend.data._M_elems + 8) =
           CONCAT35(result.m_backend.data._M_elems[9]._1_3_,result.m_backend.data._M_elems._32_5_);
      *(undefined8 *)((this->maxabs).m_backend.data._M_elems + 4) =
           result.m_backend.data._M_elems._16_8_;
      *(ulong *)((this->maxabs).m_backend.data._M_elems + 6) =
           CONCAT35(result.m_backend.data._M_elems[7]._1_3_,result.m_backend.data._M_elems._24_5_);
      *(undefined8 *)(this->maxabs).m_backend.data._M_elems = result.m_backend.data._M_elems._0_8_;
      *(undefined8 *)((this->maxabs).m_backend.data._M_elems + 2) =
           result.m_backend.data._M_elems._8_8_;
      (this->maxabs).m_backend.exp = result.m_backend.exp;
      (this->maxabs).m_backend.neg = result.m_backend.neg;
      (this->maxabs).m_backend.fpclass = result.m_backend.fpclass;
      (this->maxabs).m_backend.prec_elem = result.m_backend.prec_elem;
    }
    piVar15 = piVar15 + 1;
    piVar18 = piVar18 + 0xe;
  }
  this->stat = OK;
  return;
}

Assistant:

void CLUFactor<R>::updateNoClear(
   int p_col,
   const R* p_work,
   const int* p_idx,
   int num)
{
   int ll, i, j;
   int* lidx;
   R* lval;
   R x, rezi;

   assert(p_work[p_col] != 0.0);
   rezi = 1 / p_work[p_col];
   ll = makeLvec(num, p_col);
   //ll = fac->makeLvec(num, col);
   lval = l.val.data();
   lidx = l.idx;

   for(i = num - 1; (j = p_idx[i]) != p_col; --i)
   {
      lidx[ll] = j;
      lval[ll] = rezi * p_work[j];
      ++ll;
   }

   lidx[ll] = p_col;

   lval[ll] = 1 - rezi;
   ++ll;

   for(--i; i >= 0; --i)
   {
      j = p_idx[i];
      lidx[ll] = j;
      lval[ll] = x = rezi * p_work[j];
      ++ll;

      if(spxAbs(x) > maxabs)
         maxabs = spxAbs(x);
   }

   this->stat = SLinSolver<R>::OK;
}